

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O0

size_t __thiscall adios2::transport::FileHTTP::GetSize(FileHTTP *this)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  long in_RDI;
  size_t result;
  int nbytes_last;
  int nbytes_total;
  int request_len;
  char buffer [128];
  char request [1024];
  char request_template [53];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff720;
  allocator *paVar5;
  char *in_stack_fffffffffffff728;
  allocator *in_stack_fffffffffffff760;
  string *in_stack_fffffffffffff768;
  string *in_stack_fffffffffffff770;
  string *in_stack_fffffffffffff778;
  string *in_stack_fffffffffffff780;
  allocator local_819;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [36];
  int local_6dc;
  int local_6d8;
  allocator local_6d1;
  string local_6d0 [39];
  undefined1 local_6a9 [40];
  undefined1 local_681 [40];
  undefined1 local_659 [40];
  undefined1 local_631 [40];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [39];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [55];
  allocator local_4f1;
  string local_4f0 [36];
  int local_4cc;
  char local_4c8 [128];
  char local_448 [1024];
  char local_48 [72];
  
  memcpy(local_48,"GET %s HTTP/1.1\r\nHost: %s\r\nContent-Length: bytes\r\n\r\n",0x35);
  memset(local_4c8,0,0x80);
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  local_4cc = snprintf(local_448,0x400,local_48,uVar2,uVar3);
  if (0x3ff < local_4cc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f0,"Toolkit",&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"transport::file::FileHTTP",&local_529);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"GetSize",&local_551);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff768 >> 0x20));
    std::operator+(in_stack_fffffffffffff728,in_stack_fffffffffffff720);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
               in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20));
    std::__cxx11::string::~string(local_578);
    std::__cxx11::string::~string(local_598);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  }
  iVar1 = socket(2,1,*(int *)(in_RDI + 0x154));
  *(int *)(in_RDI + 0xf0) = iVar1;
  if (*(int *)(in_RDI + 0xf0) == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5b8,"Toolkit",&local_5b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,"transport::file::FileHTTP",&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_608,"GetSize",&local_609);
    in_stack_fffffffffffff780 = (string *)local_631;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_631 + 1),"cannot bind socket",(allocator *)in_stack_fffffffffffff780
              );
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
               in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20));
    std::__cxx11::string::~string((string *)(local_631 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_631);
    std::__cxx11::string::~string(local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  }
  iVar1 = connect(*(int *)(in_RDI + 0xf0),(sockaddr *)(in_RDI + 0x144),0x10);
  if (iVar1 == -1) {
    in_stack_fffffffffffff778 = (string *)local_659;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_659 + 1),"Toolkit",(allocator *)in_stack_fffffffffffff778);
    in_stack_fffffffffffff770 = (string *)local_681;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_681 + 1),"transport::file::FileHTTP",
               (allocator *)in_stack_fffffffffffff770);
    in_stack_fffffffffffff768 = (string *)local_6a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_6a9 + 1),"GetSize",(allocator *)in_stack_fffffffffffff768);
    in_stack_fffffffffffff760 = &local_6d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6d0,"cannot connect",in_stack_fffffffffffff760);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
               in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20));
    std::__cxx11::string::~string(local_6d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    std::__cxx11::string::~string((string *)(local_6a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_6a9);
    std::__cxx11::string::~string((string *)(local_681 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_681);
    std::__cxx11::string::~string((string *)(local_659 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_659);
  }
  for (local_6d8 = 0; local_6d8 < local_4cc; local_6d8 = local_6dc + local_6d8) {
    sVar4 = ::write(*(int *)(in_RDI + 0xf0),local_448 + local_6d8,(long)(local_4cc - local_6d8));
    local_6dc = (int)sVar4;
    if (local_6dc == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_700,"Toolkit",&local_701);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_728,"transport::file::FileHTTP",&local_729);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_750,"GetSize",&local_751);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_778,"sending request failed",&local_779);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                 in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20));
      std::__cxx11::string::~string(local_778);
      std::allocator<char>::~allocator((allocator<char> *)&local_779);
      std::__cxx11::string::~string(local_750);
      std::allocator<char>::~allocator((allocator<char> *)&local_751);
      std::__cxx11::string::~string(local_728);
      std::allocator<char>::~allocator((allocator<char> *)&local_729);
      std::__cxx11::string::~string(local_700);
      std::allocator<char>::~allocator((allocator<char> *)&local_701);
    }
  }
  do {
    sVar4 = read(*(int *)(in_RDI + 0xf0),local_4c8,0x80);
    iVar1 = (int)((ulong)in_stack_fffffffffffff760 >> 0x20);
    local_6d8 = (int)sVar4;
  } while (0 < local_6d8);
  if (local_6d8 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7a0,"Toolkit",&local_7a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c8,"transport::file::FileHTTP",&local_7c9);
    paVar5 = &local_7f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7f0,"GetSize",paVar5);
    paVar5 = &local_819;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_818,"receiving response failed",paVar5);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
               in_stack_fffffffffffff768,iVar1);
    std::__cxx11::string::~string(local_818);
    std::allocator<char>::~allocator((allocator<char> *)&local_819);
    std::__cxx11::string::~string(local_7f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
    std::__cxx11::string::~string(local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
    std::__cxx11::string::~string(local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  }
  close(*(int *)(in_RDI + 0xf0));
  iVar1 = atoi(local_4c8);
  return (long)iVar1;
}

Assistant:

size_t FileHTTP::GetSize()
{
    char request_template[] = "GET %s HTTP/1.1\r\nHost: %s\r\nContent-Length: bytes\r\n\r\n";
    enum CONSTEXPR
    {
        MAX_REQUEST_LEN = 1024,
        BUF_SIZE = 128
    };
    char request[MAX_REQUEST_LEN];
    char buffer[BUF_SIZE] = {'\0'};
    int request_len =
        snprintf(request, MAX_REQUEST_LEN, request_template, m_Name.c_str(), m_hostname.c_str());
    if (request_len >= MAX_REQUEST_LEN)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "request length too long:  " +
                                                  std::to_string(request_len));
    }
    m_socketFileDescriptor = socket(AF_INET, SOCK_STREAM, m_p_proto);
    if (m_socketFileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "cannot bind socket");
    }
    /* Actually connect. */
    if (connect(m_socketFileDescriptor, (struct sockaddr *)&sockaddr_in, sizeof(sockaddr_in)) == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "cannot connect");
    }
    /* Send HTTP request. */
    int nbytes_total = 0;
    while (nbytes_total < request_len)
    {
        int nbytes_last =
            write(m_socketFileDescriptor, request + nbytes_total, request_len - nbytes_total);
        if (nbytes_last == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                                  "sending request failed");
        }
        nbytes_total += nbytes_last;
    }

    /* Read the response. */
    while ((nbytes_total = read(m_socketFileDescriptor, buffer, BUF_SIZE)) > 0)
        ;
    if (nbytes_total == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "GetSize",
                                              "receiving response failed");
    }
    close(m_socketFileDescriptor);
    size_t result = atoi(buffer);

    return result;
}